

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

EdgeIdx __thiscall Escape::CGraph::getEdge(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long lVar1;
  long lVar2;
  
  if (v1 < this->nVertices) {
    lVar2 = this->offsets[v1];
    lVar1 = this->offsets[v1 + 1];
    if (lVar2 < lVar1) {
      do {
        if (this->nbors[lVar2] == v2) {
          return lVar2;
        }
        lVar2 = lVar2 + 1;
      } while (lVar1 != lVar2);
    }
  }
  return -1;
}

Assistant:

EdgeIdx CGraph::getEdge(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    for (EdgeIdx i = offsets[v1]; i < offsets[v1 + 1]; ++i)
        if (nbors[i] == v2)
            return i;
    return -1;
}